

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_tuple.h
# Opt level: O0

void __thiscall
absl::container_internal::
CompressedTuple<std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>_*>
::~CompressedTuple(CompressedTuple<std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>_*>
                   *this)

{
  CompressedTuple<std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>_*>
  *this_local;
  
  internal_compressed_tuple::
  CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
  ::~CompressedTupleImpl
            (&this->
              super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
            );
  return;
}

Assistant:

class ABSL_INTERNAL_COMPRESSED_TUPLE_DECLSPEC CompressedTuple
    : private internal_compressed_tuple::CompressedTupleImpl<
          CompressedTuple<Ts...>, absl::index_sequence_for<Ts...>> {
 private:
  template <int I>
  using ElemT = internal_compressed_tuple::ElemT<CompressedTuple, I>;

 public:
  constexpr CompressedTuple() = default;
  explicit constexpr CompressedTuple(Ts... base)
      : CompressedTuple::CompressedTupleImpl(absl::forward<Ts>(base)...) {}

  template <int I>
  ElemT<I>& get() & {
    return internal_compressed_tuple::Storage<CompressedTuple, I>::get();
  }

  template <int I>
  constexpr const ElemT<I>& get() const& {
    return internal_compressed_tuple::Storage<CompressedTuple, I>::get();
  }

  template <int I>
  ElemT<I>&& get() && {
    return std::move(*this)
        .internal_compressed_tuple::template Storage<CompressedTuple, I>::get();
  }

  template <int I>
  constexpr const ElemT<I>&& get() const&& {
    return absl::move(*this)
        .internal_compressed_tuple::template Storage<CompressedTuple, I>::get();
  }
}